

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O2

void __thiscall Centaurus::DFA<wchar_t>::print(DFA<wchar_t> *this,wostream *os,wstring *graph_name)

{
  pointer pDVar1;
  uint uVar2;
  wostream *pwVar3;
  wchar_t *pwVar4;
  ulong uVar5;
  
  pwVar3 = std::operator<<(os,L"digraph ");
  pwVar3 = std::operator<<(pwVar3,(wstring *)graph_name);
  pwVar3 = std::operator<<(pwVar3,L" {");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  pwVar3 = std::operator<<(os,L"rankdir=\"LR\";");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  pwVar3 = std::operator<<(os,L"graph [ charset=\"UTF-8\", style=\"filled\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  pwVar3 = std::operator<<(os,L"node [ style=\"solid,filled\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  pwVar3 = std::operator<<(os,L"edge [ style=\"solid\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  pwVar3 = std::operator<<(os,L"SS [ style=\"invisible\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  for (uVar2 = 0; uVar5 = (ulong)uVar2,
      uVar5 < (ulong)(((long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                             super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                            super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x48); uVar2 = uVar2 + 1) {
    pwVar3 = std::operator<<(os,L"S");
    pwVar3 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar3);
    std::operator<<(pwVar3,L" [ label=\"");
    (*(this->super_NFABase<Centaurus::DFAState<wchar_t>_>)._vptr_NFABase[2])(this,os,uVar5);
    pwVar4 = L"\", shape=circle";
    if ((this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
        super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar5].m_accept != false) {
      pwVar4 = L"\", shape=doublecircle";
    }
    std::operator<<(os,pwVar4);
    pwVar4 = L" ];";
    if ((this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
        super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar5].m_long != false) {
      pwVar4 = L", penwidth=2 ];";
    }
    pwVar3 = std::operator<<(os,pwVar4);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  }
  pwVar3 = std::operator<<(os,L"SS -> S0;");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  uVar2 = 0;
  while( true ) {
    uVar5 = (ulong)uVar2;
    pDVar1 = (this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
             super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                       super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x48) <= uVar5)
    break;
    (*pDVar1[uVar5].super_NFABaseState<wchar_t,_Centaurus::IndexVector>._vptr_NFABaseState[2])
              (pDVar1 + uVar5,os,uVar5);
    uVar2 = uVar2 + 1;
  }
  pwVar3 = std::operator<<(os,L"}");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar3);
  return;
}

Assistant:

virtual void print(std::wostream& os, const std::wstring& graph_name) const override
	{
		os << L"digraph " << graph_name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\", style=\"filled\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		os << L"SS [ style=\"invisible\" ];" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << L"S" << i << L" [ label=\"";
			print_state(os, i);
			if (m_states[i].is_accept_state())
				os << L"\", shape=doublecircle";
			else
				os << L"\", shape=circle";
            if (m_states[i].is_long())
                os << L", penwidth=2 ];" << std::endl;
            else
                os << L" ];" << std::endl;
		}

		os << L"SS -> S0;" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print(os, i);
		}

		os << L"}" << std::endl;
	}